

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

bool __thiscall cfd::core::ConfidentialTransaction::HasWitness(ConfidentialTransaction *this)

{
  int iVar1;
  size_t is_witness;
  size_t local_10;
  
  local_10 = 0;
  iVar1 = wally_tx_get_witness_count
                    ((wally_tx *)(this->super_AbstractTransaction).wally_tx_pointer_,&local_10);
  return local_10 != 0 && iVar1 == 0;
}

Assistant:

bool ConfidentialTransaction::HasWitness() const {
  size_t is_witness = 0;
  int ret = wally_tx_get_witness_count(
      static_cast<struct wally_tx *>(wally_tx_pointer_), &is_witness);
  if (ret == WALLY_OK) {
    return (is_witness != 0);
  }
  return false;
}